

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaJsonWriter::WriteString(VmaJsonWriter *this,char *pStr)

{
  VmaVector<char,_VmaStlAllocator<char>_> *this_00;
  size_t sVar1;
  
  BeginString(this,pStr);
  this_00 = &this->m_SB->m_Data;
  sVar1 = this_00->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(this_00,sVar1 + 1);
  this_00->m_pArray[sVar1] = '\"';
  this->m_InsideString = false;
  return;
}

Assistant:

void VmaJsonWriter::WriteString(const char* pStr)
{
    BeginString(pStr);
    EndString();
}